

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall dxil_spv::CFGStructurizer::recompute_cfg(CFGStructurizer *this)

{
  CFGStructurizer *this_local;
  
  reset_traversal(this);
  visit(this,this->entry_block);
  prune_dead_preds(this);
  build_immediate_dominators(this);
  build_reachability(this);
  backwards_visit(this);
  build_immediate_post_dominators(this);
  compute_dominance_frontier(this);
  compute_post_dominance_frontier(this);
  return;
}

Assistant:

void CFGStructurizer::recompute_cfg()
{
	reset_traversal();
	visit(*entry_block);
	// Need to prune dead preds before computing dominance.
	prune_dead_preds();
	build_immediate_dominators();
	build_reachability();

	backwards_visit();
	build_immediate_post_dominators();

	compute_dominance_frontier();
	compute_post_dominance_frontier();
}